

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetReference<Js::StringProfiler::UintUintPair>
          (BaseDictionary<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           *this,UintUintPair *key,ConcatMetrics **value,int *index)

{
  UintUintPair UVar1;
  Type piVar2;
  hash_t hVar3;
  Type pSVar4;
  uint uVar5;
  ulong extraout_RDX;
  uint uVar7;
  uint depth;
  undefined1 auVar8 [16];
  ulong uVar6;
  
  piVar2 = this->buckets;
  depth = 0;
  if (piVar2 != (Type)0x0) {
    hVar3 = PrimePolicy::ModPrime
                      ((key->first * 2 | key->second << 0x11) >> 1,this->bucketCount,
                       this->modFunctionIndex);
    uVar7 = piVar2[hVar3];
    depth = 0;
    if (-1 < (int)uVar7) {
      pSVar4 = this->entries;
      depth = 0;
      uVar6 = extraout_RDX;
      do {
        UVar1 = pSVar4[uVar7].
                super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                .
                super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                .
                super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                .key;
        auVar8._0_4_ = -(uint)(UVar1.first == (*key).first);
        auVar8._4_4_ = -(uint)(UVar1.second == (*key).second);
        auVar8._8_4_ = 0xffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar8 = pmovsxdq(auVar8,auVar8);
        uVar5 = movmskpd((int)uVar6,auVar8);
        uVar6 = (ulong)uVar5;
        if (uVar5 == 3) {
          if (this->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(this->stats,depth);
            pSVar4 = this->entries;
          }
          *value = (ConcatMetrics *)(pSVar4 + uVar7);
          *index = uVar7;
          return true;
        }
        depth = depth + 1;
        uVar7 = pSVar4[uVar7].
                super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                .
                super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                .
                super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                .next;
      } while (-1 < (int)uVar7);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this->stats,depth);
  }
  return false;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }